

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::MarkScript
          (FunctionBody *this,ByteBlock *byteCodeBlock,ByteBlock *auxBlock,
          ByteBlock *auxContextBlock,uint byteCodeCount,uint byteCodeInLoopCount,
          uint byteCodeWithoutLDACount)

{
  Utf8SourceInfo *this_00;
  uint byteCodeInLoopCount_local;
  uint byteCodeCount_local;
  ByteBlock *auxContextBlock_local;
  ByteBlock *auxBlock_local;
  ByteBlock *byteCodeBlock_local;
  FunctionBody *this_local;
  
  CheckNotExecuting(this);
  CheckEmpty(this);
  SetByteCodeCount(this,byteCodeCount);
  SetByteCodeInLoopCount(this,byteCodeInLoopCount);
  SetByteCodeWithoutLDACount(this,byteCodeWithoutLDACount);
  FunctionExecutionStateMachine::InitializeExecutionModeAndLimits(&this->executionState,this);
  SetAuxiliaryData(this,auxBlock);
  SetAuxiliaryContextData(this,auxContextBlock);
  MemoryBarrier();
  Memory::WriteBarrierPtr<Js::ByteBlock>::operator=(&this->byteCodeBlock,byteCodeBlock);
  if ((*(uint *)&this->field_0x178 >> 3 & 1) == 0) {
    this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
    Utf8SourceInfo::SetFunctionBody(this_00,this);
  }
  return;
}

Assistant:

void FunctionBody::MarkScript(ByteBlock *byteCodeBlock, ByteBlock* auxBlock, ByteBlock* auxContextBlock,
        uint byteCodeCount, uint byteCodeInLoopCount, uint byteCodeWithoutLDACount)
    {
        CheckNotExecuting();
        CheckEmpty();

#ifdef PERF_COUNTERS
        DWORD byteCodeSize = byteCodeBlock->GetLength()
            + (auxBlock? auxBlock->GetLength() : 0)
            + (auxContextBlock? auxContextBlock->GetLength() : 0);
        PERF_COUNTER_ADD(Code, DynamicByteCodeSize, byteCodeSize);
#endif

        SetByteCodeCount(byteCodeCount);
        SetByteCodeInLoopCount(byteCodeInLoopCount);
        SetByteCodeWithoutLDACount(byteCodeWithoutLDACount);

        executionState.InitializeExecutionModeAndLimits(this);

        this->SetAuxiliaryData(auxBlock);
        this->SetAuxiliaryContextData(auxContextBlock);

        // Memory barrier needed here to make sure the background codegen thread's inliner
        // gets all the assignment before it sees that the function has been parse
        MemoryBarrier();

        this->byteCodeBlock = byteCodeBlock;
        PERF_COUNTER_ADD(Code, TotalByteCodeSize, byteCodeSize);

        // If this is a defer parse function body, we would not have registered it
        // on the function bodies list so we should register it now
        if (!this->m_isFuncRegistered)
        {
            this->GetUtf8SourceInfo()->SetFunctionBody(this);
        }
    }